

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O0

void cf_cbc_decrypt(cf_cbc *ctx,uint8_t *input,uint8_t *output,size_t blocks)

{
  size_t len;
  size_t nblk;
  uint8_t buf [16];
  size_t blocks_local;
  uint8_t *output_local;
  uint8_t *input_local;
  cf_cbc *ctx_local;
  
  len = ctx->prp->blocksz;
  buf._8_8_ = blocks;
  blocks_local = (size_t)output;
  output_local = input;
  while (buf._8_8_ != 0) {
    buf._8_8_ = buf._8_8_ + -1;
    (*ctx->prp->decrypt)(ctx->prpctx,output_local,(uint8_t *)&nblk);
    xor_bb((uint8_t *)blocks_local,(uint8_t *)&nblk,ctx->block,len);
    memcpy(ctx->block,output_local,len);
    output_local = output_local + len;
    blocks_local = len + blocks_local;
  }
  return;
}

Assistant:

void cf_cbc_decrypt(cf_cbc *ctx, const uint8_t *input, uint8_t *output, size_t blocks)
{
  uint8_t buf[CF_MAXBLOCK];
  size_t nblk = ctx->prp->blocksz;

  while (blocks--)
  {
    ctx->prp->decrypt(ctx->prpctx, input, buf);
    xor_bb(output, buf, ctx->block, nblk);
    memcpy(ctx->block, input, nblk);
    input += nblk;
    output += nblk;
  }
}